

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O2

void tcg_gen_gvec_cmp_sparc64
               (TCGContext_conflict8 *tcg_ctx,TCGCond cond,uint vece,uint32_t dofs,uint32_t aofs,
               uint32_t bofs,uint32_t oprsz,uint32_t maxsz)

{
  TCGType TVar1;
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  ulong uVar2;
  ulong uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint local_58;
  
  uVar3 = (ulong)cond;
  local_58 = oprsz;
  check_overlap_3(dofs,aofs,bofs,maxsz);
  if (cond < TCG_COND_LT) {
    do_dup(tcg_ctx,0,dofs,oprsz,maxsz,(TCGv_i32)0x0,(TCGv_i64)0x0,(long)(int)-cond);
    return;
  }
  TVar1 = choose_vector_type(tcg_ctx,tcg_gen_gvec_cmp_sparc64::cmp_list,vece,oprsz,vece == 3);
  switch(TVar1) {
  case TCG_TYPE_I32:
    if (vece == 3) {
      if (0x1f < oprsz - 8 || (oprsz & 7) != 0) {
LAB_0091b546:
        uVar4 = bofs;
        if ((0xe8ebUL >> (uVar3 & 0x3f) & 1) != 0) {
          uVar2 = (ulong)(cond ^ TCG_COND_NE);
          if ((cond & (TCG_COND_LTU|TCG_COND_LT)) == TCG_COND_NEVER) {
            uVar2 = uVar3;
          }
          uVar3 = uVar2;
          uVar4 = aofs;
          aofs = bofs;
          if ((0xe8ebUL >> (uVar2 & 0x3f) & 1) != 0) {
            __assert_fail("fn != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg-op-gvec.c"
                          ,0xc90,
                          "void tcg_gen_gvec_cmp_sparc64(TCGContext *, TCGCond, unsigned int, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t)"
                         );
          }
        }
        tcg_gen_gvec_3_ool_sparc64
                  (tcg_ctx,dofs,aofs,uVar4,oprsz,maxsz,0,tcg_gen_gvec_cmp_sparc64::fns[uVar3][vece])
        ;
        return;
      }
      ret = tcg_temp_new_i64(tcg_ctx);
      ret_00 = tcg_temp_new_i64(tcg_ctx);
      for (uVar5 = 0; uVar5 < oprsz; uVar5 = uVar5 + 8) {
        tcg_gen_ld_i64_sparc64(tcg_ctx,ret,tcg_ctx->cpu_env,(ulong)(aofs + uVar5));
        tcg_gen_ld_i64_sparc64(tcg_ctx,ret_00,tcg_ctx->cpu_env,(ulong)(bofs + uVar5));
        tcg_gen_setcond_i64_sparc64(tcg_ctx,cond,ret,ret,ret_00);
        tcg_gen_neg_i64(tcg_ctx,ret,ret);
        tcg_gen_st_i64_sparc64(tcg_ctx,ret,tcg_ctx->cpu_env,(ulong)(dofs + uVar5));
      }
    }
    else {
      if (((0xf < oprsz - 4) || (vece != 2)) || ((oprsz & 3) != 0)) goto LAB_0091b546;
      ret = (TCGv_i64)tcg_temp_new_i32(tcg_ctx);
      ret_00 = (TCGv_i64)tcg_temp_new_i32(tcg_ctx);
      for (uVar5 = 0; uVar5 < oprsz; uVar5 = uVar5 + 4) {
        tcg_gen_ld_i32(tcg_ctx,(TCGv_i32)ret,tcg_ctx->cpu_env,(ulong)(aofs + uVar5));
        tcg_gen_ld_i32(tcg_ctx,(TCGv_i32)ret_00,tcg_ctx->cpu_env,(ulong)(bofs + uVar5));
        tcg_gen_setcond_i32_sparc64(tcg_ctx,cond,(TCGv_i32)ret,(TCGv_i32)ret,(TCGv_i32)ret_00);
        tcg_gen_neg_i32(tcg_ctx,(TCGv_i32)ret,(TCGv_i32)ret);
        tcg_gen_st_i32(tcg_ctx,(TCGv_i32)ret,tcg_ctx->cpu_env,(ulong)(dofs + uVar5));
      }
    }
    tcg_temp_free_internal_sparc64(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
    tcg_temp_free_internal_sparc64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
    goto LAB_0091b418;
  default:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg-op-gvec.c"
               ,0xc98,(char *)0x0);
  case TCG_TYPE_V64:
    TVar1 = TCG_TYPE_V64;
    uVar4 = 8;
    goto LAB_0091b40f;
  case TCG_TYPE_V128:
    break;
  case TCG_TYPE_V256:
    uVar5 = oprsz & 0xffffffe0;
    expand_cmp_vec(tcg_ctx,vece,dofs,aofs,bofs,uVar5,0x20,TCG_TYPE_V256,cond);
    if (uVar5 == oprsz) goto LAB_0091b418;
    dofs = dofs + uVar5;
    aofs = aofs + uVar5;
    bofs = bofs + uVar5;
    local_58 = oprsz & 0x1f;
    maxsz = maxsz - uVar5;
  }
  TVar1 = TCG_TYPE_V128;
  uVar4 = 0x10;
  oprsz = local_58;
LAB_0091b40f:
  expand_cmp_vec(tcg_ctx,vece,dofs,aofs,bofs,oprsz,uVar4,TVar1,cond);
LAB_0091b418:
  if (maxsz < oprsz || maxsz - oprsz == 0) {
    return;
  }
  expand_clr(tcg_ctx,dofs + oprsz,maxsz - oprsz);
  return;
}

Assistant:

void tcg_gen_gvec_cmp(TCGContext *tcg_ctx, TCGCond cond, unsigned vece, uint32_t dofs,
                      uint32_t aofs, uint32_t bofs,
                      uint32_t oprsz, uint32_t maxsz)
{
    static const TCGOpcode cmp_list[] = { INDEX_op_cmp_vec, 0 };
    static gen_helper_gvec_3 * const eq_fn[4] = {
        gen_helper_gvec_eq8, gen_helper_gvec_eq16,
        gen_helper_gvec_eq32, gen_helper_gvec_eq64
    };
    static gen_helper_gvec_3 * const ne_fn[4] = {
        gen_helper_gvec_ne8, gen_helper_gvec_ne16,
        gen_helper_gvec_ne32, gen_helper_gvec_ne64
    };
    static gen_helper_gvec_3 * const lt_fn[4] = {
        gen_helper_gvec_lt8, gen_helper_gvec_lt16,
        gen_helper_gvec_lt32, gen_helper_gvec_lt64
    };
    static gen_helper_gvec_3 * const le_fn[4] = {
        gen_helper_gvec_le8, gen_helper_gvec_le16,
        gen_helper_gvec_le32, gen_helper_gvec_le64
    };
    static gen_helper_gvec_3 * const ltu_fn[4] = {
        gen_helper_gvec_ltu8, gen_helper_gvec_ltu16,
        gen_helper_gvec_ltu32, gen_helper_gvec_ltu64
    };
    static gen_helper_gvec_3 * const leu_fn[4] = {
        gen_helper_gvec_leu8, gen_helper_gvec_leu16,
        gen_helper_gvec_leu32, gen_helper_gvec_leu64
    };
    static gen_helper_gvec_3 * const * const fns[16] = {
        [TCG_COND_EQ] = eq_fn,
        [TCG_COND_NE] = ne_fn,
        [TCG_COND_LT] = lt_fn,
        [TCG_COND_LE] = le_fn,
        [TCG_COND_LTU] = ltu_fn,
        [TCG_COND_LEU] = leu_fn,
    };

    const TCGOpcode *hold_list;
    TCGType type;
    uint32_t some;

    check_size_align(oprsz, maxsz, dofs | aofs | bofs);
    check_overlap_3(dofs, aofs, bofs, maxsz);

    if (cond == TCG_COND_NEVER || cond == TCG_COND_ALWAYS) {
        do_dup(tcg_ctx, MO_8, dofs, oprsz, maxsz,
               NULL, NULL, -(cond == TCG_COND_ALWAYS));
        return;
    }

    /*
     * Implement inline with a vector type, if possible.
     * Prefer integer when 64-bit host and 64-bit comparison.
     */
    hold_list = tcg_swap_vecop_list(cmp_list);
    type = choose_vector_type(tcg_ctx, cmp_list, vece, oprsz,
                              TCG_TARGET_REG_BITS == 64 && vece == MO_64);
    switch (type) {
    case TCG_TYPE_V256:
        /* Recall that ARM SVE allows vector sizes that are not a
         * power of 2, but always a multiple of 16.  The intent is
         * that e.g. size == 80 would be expanded with 2x32 + 1x16.
         */
        some = QEMU_ALIGN_DOWN(oprsz, 32);
        expand_cmp_vec(tcg_ctx, vece, dofs, aofs, bofs, some, 32, TCG_TYPE_V256, cond);
        if (some == oprsz) {
            break;
        }
        dofs += some;
        aofs += some;
        bofs += some;
        oprsz -= some;
        maxsz -= some;
        /* fallthru */
    case TCG_TYPE_V128:
        expand_cmp_vec(tcg_ctx, vece, dofs, aofs, bofs, oprsz, 16, TCG_TYPE_V128, cond);
        break;
    case TCG_TYPE_V64:
        expand_cmp_vec(tcg_ctx, vece, dofs, aofs, bofs, oprsz, 8, TCG_TYPE_V64, cond);
        break;

    case 0:
        if (vece == MO_64 && check_size_impl(oprsz, 8)) {
            expand_cmp_i64(tcg_ctx, dofs, aofs, bofs, oprsz, cond);
        } else if (vece == MO_32 && check_size_impl(oprsz, 4)) {
            expand_cmp_i32(tcg_ctx, dofs, aofs, bofs, oprsz, cond);
        } else {
            gen_helper_gvec_3 * const *fn = fns[cond];

            if (fn == NULL) {
                uint32_t tmp;
                tmp = aofs, aofs = bofs, bofs = tmp;
                cond = tcg_swap_cond(cond);
                fn = fns[cond];
                assert(fn != NULL);
            }
            tcg_gen_gvec_3_ool(tcg_ctx, dofs, aofs, bofs, oprsz, maxsz, 0, fn[vece]);
            oprsz = maxsz;
        }
        break;

    default:
        g_assert_not_reached();
    }
    tcg_swap_vecop_list(hold_list);

    if (oprsz < maxsz) {
        expand_clr(tcg_ctx, dofs + oprsz, maxsz - oprsz);
    }
}